

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManPlacementRefine(Emb_Man_t *p,int nIters,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  void *__ptr;
  void *__ptr_00;
  float *pArray;
  float *pArray_00;
  int *__ptr_01;
  int *__ptr_02;
  abctime aVar3;
  bool bVar4;
  abctime clk;
  uint local_88;
  int iMaxY;
  int iMinY;
  int iMaxX;
  int iMinX;
  int Iter;
  int k;
  int i;
  int *pPermY;
  int *pPermX;
  float VertY;
  float VertX;
  float *pVertY;
  float *pVertX;
  float *pEdgeY;
  float *pEdgeX;
  double CostPrev;
  double CostThis;
  Emb_Obj_t *pNext;
  Emb_Obj_t *pThis;
  int fVerbose_local;
  int nIters_local;
  Emb_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  if (p->pPlacement != (unsigned_short *)0x0) {
    __ptr = malloc((long)p->nObjs << 2);
    __ptr_00 = malloc((long)p->nObjs << 2);
    pArray = (float *)malloc((long)p->nObjs << 2);
    pArray_00 = (float *)malloc((long)p->nObjs << 2);
    for (iMaxX = 0; iMaxX < nIters; iMaxX = iMaxX + 1) {
      CostPrev = 0.0;
      Iter = 0;
      while( true ) {
        bVar4 = false;
        if (Iter < p->nObjData) {
          pNext = Emb_ManObj(p,Iter);
          bVar4 = pNext != (Emb_Obj_t *)0x0;
        }
        if (!bVar4) break;
        iMaxY = (int)p->pPlacement[(pNext->field_8).Value << 1];
        clk._4_4_ = (uint)p->pPlacement[(pNext->field_8).Value * 2 + 1];
        iMinX = 0;
        local_88 = clk._4_4_;
        iMinY = iMaxY;
        while( true ) {
          bVar4 = false;
          if (iMinX < (int)pNext->nFanouts) {
            CostThis = (double)Emb_ObjFanout(pNext,iMinX);
            bVar4 = (Emb_Obj_t *)CostThis != (Emb_Obj_t *)0x0;
          }
          if (!bVar4) break;
          iMinY = Abc_MinInt(iMinY,(uint)p->pPlacement[(uint)(*(int *)((long)CostThis + 0x10) << 1)]
                            );
          iMaxY = Abc_MaxInt(iMaxY,(uint)p->pPlacement[(uint)(*(int *)((long)CostThis + 0x10) << 1)]
                            );
          local_88 = Abc_MinInt(local_88,(uint)p->pPlacement
                                               [*(int *)((long)CostThis + 0x10) * 2 + 1]);
          clk._4_4_ = Abc_MaxInt(clk._4_4_,
                                 (uint)p->pPlacement[*(int *)((long)CostThis + 0x10) * 2 + 1]);
          iMinX = iMinX + 1;
        }
        *(float *)((long)__ptr + (ulong)(pNext->field_8).Value * 4) = (float)(iMaxY + iMinY) * 0.5;
        *(float *)((long)__ptr_00 + (ulong)(pNext->field_8).Value * 4) =
             (float)(int)(clk._4_4_ + local_88) * 0.5;
        CostPrev = (double)(int)((iMaxY - iMinY) + (clk._4_4_ - local_88)) + CostPrev;
        iVar1 = Emb_ObjSize(pNext);
        Iter = iVar1 + Iter;
      }
      Iter = 0;
      while( true ) {
        bVar4 = false;
        if (Iter < p->nObjData) {
          pNext = Emb_ManObj(p,Iter);
          bVar4 = pNext != (Emb_Obj_t *)0x0;
        }
        if (!bVar4) break;
        pPermX._4_4_ = *(float *)((long)__ptr + (ulong)(pNext->field_8).Value * 4);
        pPermX._0_4_ = *(float *)((long)__ptr_00 + (ulong)(pNext->field_8).Value * 4);
        iMinX = 0;
        while( true ) {
          bVar4 = false;
          if (iMinX < (int)(*(uint *)pNext >> 4)) {
            CostThis = (double)Emb_ObjFanin(pNext,iMinX);
            bVar4 = (Emb_Obj_t *)CostThis != (Emb_Obj_t *)0x0;
          }
          if (!bVar4) break;
          pPermX._4_4_ = *(float *)((long)__ptr + (ulong)*(uint *)((long)CostThis + 0x10) * 4) +
                         pPermX._4_4_;
          pPermX._0_4_ = *(float *)((long)__ptr_00 + (ulong)*(uint *)((long)CostThis + 0x10) * 4) +
                         pPermX._0_4_;
          iMinX = iMinX + 1;
        }
        iVar1 = Emb_ObjFaninNum(pNext);
        pArray[(pNext->field_8).Value] = pPermX._4_4_ / (float)(iVar1 + 1);
        iVar1 = Emb_ObjFaninNum(pNext);
        pArray_00[(pNext->field_8).Value] = pPermX._0_4_ / (float)(iVar1 + 1);
        iVar1 = Emb_ObjSize(pNext);
        Iter = iVar1 + Iter;
      }
      __ptr_01 = Gia_SortFloats(pArray,(int *)0x0,p->nObjs);
      __ptr_02 = Gia_SortFloats(pArray_00,(int *)0x0,p->nObjs);
      for (iMinX = 0; iMinX < p->nObjs; iMinX = iMinX + 1) {
        p->pPlacement[__ptr_01[iMinX] << 1] =
             (unsigned_short)(int)(((double)iMinX * 1.0 * 32767.0) / (double)p->nObjs);
        p->pPlacement[__ptr_02[iMinX] * 2 + 1] =
             (unsigned_short)(int)(((double)iMinX * 1.0 * 32767.0) / (double)p->nObjs);
      }
      if (__ptr_01 != (int *)0x0) {
        free(__ptr_01);
      }
      if (__ptr_02 != (int *)0x0) {
        free(__ptr_02);
      }
      if (fVerbose != 0) {
        printf("%2d : HPWL = %e  ",CostPrev,(ulong)(iMaxX + 1));
        Abc_Print(1,"%s =","Time");
        aVar3 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
      }
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    if (pArray != (float *)0x0) {
      free(pArray);
    }
    if (pArray_00 != (float *)0x0) {
      free(pArray_00);
    }
  }
  return;
}

Assistant:

void Emb_ManPlacementRefine( Emb_Man_t * p, int nIters, int fVerbose )
{
    Emb_Obj_t * pThis, * pNext;
    double CostThis, CostPrev;
    float * pEdgeX, * pEdgeY;
    float * pVertX, * pVertY;
    float VertX, VertY;
    int * pPermX, * pPermY;
    int i, k, Iter, iMinX, iMaxX, iMinY, iMaxY;
    abctime clk = Abc_Clock();
    if ( p->pPlacement == NULL )
        return;
    pEdgeX = ABC_ALLOC( float, p->nObjs );
    pEdgeY = ABC_ALLOC( float, p->nObjs );
    pVertX = ABC_ALLOC( float, p->nObjs );
    pVertY = ABC_ALLOC( float, p->nObjs );
    // refine placement
    CostPrev = 0.0;
    for ( Iter = 0; Iter < nIters; Iter++ )
    {
        // compute centers of hyperedges
        CostThis = 0.0;
        Emb_ManForEachObj( p, pThis, i )
        {
            iMinX = iMaxX = p->pPlacement[2*pThis->Value+0];
            iMinY = iMaxY = p->pPlacement[2*pThis->Value+1];
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                iMinX = Abc_MinInt( iMinX, p->pPlacement[2*pNext->Value+0] );
                iMaxX = Abc_MaxInt( iMaxX, p->pPlacement[2*pNext->Value+0] );
                iMinY = Abc_MinInt( iMinY, p->pPlacement[2*pNext->Value+1] );
                iMaxY = Abc_MaxInt( iMaxY, p->pPlacement[2*pNext->Value+1] );
            }
            pEdgeX[pThis->Value] = 0.5 * (iMaxX + iMinX);
            pEdgeY[pThis->Value] = 0.5 * (iMaxY + iMinY);
            CostThis += (iMaxX - iMinX) + (iMaxY - iMinY);
        }
        // compute new centers of objects
        Emb_ManForEachObj( p, pThis, i )
        {
            VertX = pEdgeX[pThis->Value];
            VertY = pEdgeY[pThis->Value];
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                VertX += pEdgeX[pNext->Value];
                VertY += pEdgeY[pNext->Value];
            }
            pVertX[pThis->Value] = VertX / (Emb_ObjFaninNum(pThis) + 1);
            pVertY[pThis->Value] = VertY / (Emb_ObjFaninNum(pThis) + 1);
        }
        // sort these numbers
        pPermX = Gia_SortFloats( pVertX, NULL, p->nObjs );
        pPermY = Gia_SortFloats( pVertY, NULL, p->nObjs );
        for ( k = 0; k < p->nObjs; k++ )
        {
            p->pPlacement[2*pPermX[k]+0] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
            p->pPlacement[2*pPermY[k]+1] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
        }
        ABC_FREE( pPermX );
        ABC_FREE( pPermY );
        // evaluate cost
        if ( fVerbose )
        {
        printf( "%2d : HPWL = %e  ", Iter+1, CostThis );
        ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    ABC_FREE( pEdgeX );
    ABC_FREE( pEdgeY );
    ABC_FREE( pVertX );
    ABC_FREE( pVertY );
}